

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O1

CURLcode Curl_headers_cleanup(Curl_easy *data)

{
  Curl_llist_element *pCVar1;
  void **ppvVar2;
  
  pCVar1 = (data->state).httphdrs.head;
  while (pCVar1 != (Curl_llist_element *)0x0) {
    ppvVar2 = &pCVar1->ptr;
    pCVar1 = pCVar1->next;
    (*Curl_cfree)(*ppvVar2);
  }
  Curl_llist_init(&(data->state).httphdrs,(Curl_llist_dtor)0x0);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_headers_cleanup(struct Curl_easy *data)
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *n;

  for(e = data->state.httphdrs.head; e; e = n) {
    struct Curl_header_store *hs = e->ptr;
    n = e->next;
    free(hs);
  }
  headers_init(data);
  return CURLE_OK;
}